

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapePermuteLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RangeValue *pRVar1;
  unsigned_long uVar2;
  Arena *pAVar3;
  unsigned_long uVar4;
  Arena *pAVar5;
  size_t sVar6;
  size_t sVar7;
  undefined7 uVar8;
  bool bVar9;
  undefined7 uVar10;
  LogMessage *pLVar11;
  mapped_type *this_00;
  ShapeRange *pSVar12;
  LayerUnion from;
  mapped_type *this_01;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> outranges;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  PermuteLayerParams permute;
  LogFinisher local_b1;
  undefined1 local_b0 [56];
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> local_78;
  PermuteLayerParams local_60;
  unsigned_long local_38;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            (&local_78,4,(allocator_type *)local_b0);
  pSVar12 = ShapeConstraint::sequenceRange(this_00);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_maximum).field_0x1 = uVar8;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._val = sVar7;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._isUnbound = bVar9;
  *(undefined7 *)
   &((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_minimum).field_0x1 = uVar10;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._val = sVar6;
  pSVar12 = ShapeConstraint::channelRange(this_00);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._maximum.field_0x1 = uVar8;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._val = sVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._isUnbound = bVar9;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._minimum.field_0x1 = uVar10;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._val = sVar6;
  pSVar12 = ShapeConstraint::heightRange(this_00);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._maximum.field_0x1 = uVar8;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._val = sVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._isUnbound = bVar9;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._minimum.field_0x1 = uVar10;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._val = sVar6;
  pSVar12 = ShapeConstraint::widthRange(this_00);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._maximum.field_0x1 = uVar8;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._val = sVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._isUnbound = bVar9;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._minimum.field_0x1 = uVar10;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._val = sVar6;
  if (specLayer->_oneof_case_[0] == 0x136) {
    from = specLayer->layer_;
  }
  else {
    from.permute_ = Specification::PermuteLayerParams::default_instance();
  }
  Specification::PermuteLayerParams::PermuteLayerParams(&local_60,from.permute_);
  if (local_60.axis_.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  uVar2 = (local_60.axis_.rep_)->elements[0];
  if (local_60.axis_.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  pAVar3 = local_60.axis_.rep_[1].arena;
  if (local_60.axis_.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  uVar4 = local_60.axis_.rep_[1].elements[0];
  local_38 = uVar2;
  if (local_60.axis_.current_size_ < 4) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  pAVar5 = local_60.axis_.rep_[2].arena;
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  uVar2 = local_38;
  ShapeConstraint::updateSequenceRange
            (this_01,local_78.
                     super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                     _M_impl.super__Vector_impl_data._M_start + local_38);
  ShapeConstraint::updateChannelRange
            (this_01,local_78.
                     super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pAVar3);
  ShapeConstraint::updateHeightRange
            (this_01,local_78.
                     super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar4);
  ShapeConstraint::updateWidthRange
            (this_01,local_78.
                     super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)pAVar5);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b0,4,
             (allocator_type *)&local_b1);
  pSVar12 = ShapeConstraint::sequenceRange(this_01);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar2 * 0x20))->_maximum;
  pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)&pRVar1->field_0x1 = uVar8;
  pRVar1->_val = sVar7;
  pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar2 * 0x20);
  (pSVar12->_minimum)._isUnbound = bVar9;
  *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar10;
  (pSVar12->_minimum)._val = sVar6;
  pSVar12 = ShapeConstraint::channelRange(this_01);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  pRVar1 = &((ShapeRange *)(local_b0._0_8_ + pAVar3 * 0x20))->_maximum;
  pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)&pRVar1->field_0x1 = uVar8;
  pRVar1->_val = sVar7;
  pSVar12 = (ShapeRange *)(local_b0._0_8_ + pAVar3 * 0x20);
  (pSVar12->_minimum)._isUnbound = bVar9;
  *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar10;
  (pSVar12->_minimum)._val = sVar6;
  pSVar12 = ShapeConstraint::heightRange(this_01);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar4 * 0x20))->_maximum;
  pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)&pRVar1->field_0x1 = uVar8;
  pRVar1->_val = sVar7;
  pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar4 * 0x20);
  (pSVar12->_minimum)._isUnbound = bVar9;
  *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar10;
  (pSVar12->_minimum)._val = sVar6;
  pSVar12 = ShapeConstraint::widthRange(this_01);
  bVar9 = (pSVar12->_minimum)._isUnbound;
  uVar10 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar6 = (pSVar12->_minimum)._val;
  uVar8 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar7 = (pSVar12->_maximum)._val;
  pRVar1 = &((ShapeRange *)(local_b0._0_8_ + pAVar5 * 0x20))->_maximum;
  pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)&pRVar1->field_0x1 = uVar8;
  pRVar1->_val = sVar7;
  pSVar12 = (ShapeRange *)(local_b0._0_8_ + pAVar5 * 0x20);
  (pSVar12->_minimum)._isUnbound = bVar9;
  *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar10;
  (pSVar12->_minimum)._val = sVar6;
  ShapeConstraint::updateSequenceRange(this_00,(ShapeRange *)local_b0._0_8_);
  ShapeConstraint::updateChannelRange(this_00,(ShapeRange *)(local_b0._0_8_ + 0x20));
  ShapeConstraint::updateHeightRange(this_00,(ShapeRange *)(local_b0._0_8_ + 0x40));
  ShapeConstraint::updateWidthRange(this_00,(ShapeRange *)(local_b0._0_8_ + 0x60));
  pSVar12 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar12);
  if ((ShapeRange *)local_b0._0_8_ != (ShapeRange *)0x0) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
  }
  Specification::PermuteLayerParams::~PermuteLayerParams(&local_60);
  if (local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePermuteLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    std::vector<ShapeRange> ranges(4);
    ranges[0] = inputShape.sequenceRange();
    ranges[1] = inputShape.channelRange();
    ranges[2] = inputShape.heightRange();
    ranges[3] = inputShape.widthRange();

    Specification::PermuteLayerParams permute = specLayer.permute();
    size_t axis0 = static_cast<size_t>(permute.axis(0));
    size_t axis1 = static_cast<size_t>(permute.axis(1));
    size_t axis2 = static_cast<size_t>(permute.axis(2));
    size_t axis3 = static_cast<size_t>(permute.axis(3));

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.setName(specLayer.output(0));
    outputShape.updateSequenceRange(ranges[axis0]);
    outputShape.updateChannelRange(ranges[axis1]);
    outputShape.updateHeightRange(ranges[axis2]);
    outputShape.updateWidthRange(ranges[axis3]);

    // Need for the reverse pass as well
    std::vector<ShapeRange> outranges(4);
    outranges[axis0] = outputShape.sequenceRange();
    outranges[axis1] = outputShape.channelRange();
    outranges[axis2] = outputShape.heightRange();
    outranges[axis3] = outputShape.widthRange();

    // Need the constraints to go both ways here
    inputShape.updateSequenceRange(outranges[0]);
    inputShape.updateChannelRange(outranges[1]);
    inputShape.updateHeightRange(outranges[2]);
    inputShape.updateWidthRange(outranges[3]);

    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif
    
}